

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.c
# Opt level: O2

int cgltf_parse_json_texture_view
              (jsmntok_t *tokens,int i,uint8_t *json_chunk,cgltf_texture_view *out_texture_view)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  cgltf_texture_view *out_extras;
  cgltf_texture_view *pcVar6;
  cgltf_texture_view *pcVar7;
  ulong uVar8;
  int iVar9;
  jsmntok_t *pjVar10;
  cgltf_float cVar11;
  int local_64;
  
  if (tokens[(uint)i].type == JSMN_OBJECT) {
    out_texture_view->scale = 1.0;
    (out_texture_view->transform).scale[0] = 1.0;
    (out_texture_view->transform).scale[1] = 1.0;
    iVar1 = tokens[(uint)i].size;
    uVar8 = (ulong)(i + 1);
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    iVar9 = 0;
    out_extras = out_texture_view;
    do {
      iVar5 = (int)uVar8;
      if (iVar9 == iVar1) {
        return iVar5;
      }
      if ((tokens[uVar8].type != JSMN_STRING) || (pjVar10 = tokens + uVar8, pjVar10->size == 0)) {
        return -1;
      }
      iVar2 = cgltf_json_strcmp(pjVar10,json_chunk,"index");
      if (iVar2 == 0) {
        iVar2 = cgltf_json_to_int(tokens + (long)iVar5 + 1,json_chunk);
        out_texture_view->texture = (cgltf_texture *)((long)iVar2 + 1);
        out_extras = out_texture_view;
LAB_0027779b:
        uVar8 = (ulong)(iVar5 + 2);
      }
      else {
        iVar2 = cgltf_json_strcmp(pjVar10,json_chunk,"texCoord");
        if (iVar2 == 0) {
          iVar2 = cgltf_json_to_int(tokens + (long)iVar5 + 1,json_chunk);
          out_texture_view->texcoord = iVar2;
          out_extras = out_texture_view;
          goto LAB_0027779b;
        }
        iVar2 = cgltf_json_strcmp(pjVar10,json_chunk,"scale");
        if ((iVar2 == 0) || (iVar2 = cgltf_json_strcmp(pjVar10,json_chunk,"strength"), iVar2 == 0))
        {
          cVar11 = cgltf_json_to_float(tokens + (long)iVar5 + 1,json_chunk);
          out_texture_view->scale = cVar11;
          goto LAB_0027779b;
        }
        iVar2 = cgltf_json_strcmp(pjVar10,json_chunk,"extras");
        if (iVar2 == 0) {
          uVar3 = cgltf_parse_json_extras
                            (tokens,iVar5 + 1,(uint8_t *)&out_texture_view->extras,
                             (cgltf_extras *)out_extras);
LAB_002777bf:
          uVar8 = (ulong)uVar3;
        }
        else {
          iVar2 = cgltf_json_strcmp(pjVar10,json_chunk,"extensions");
          if (iVar2 != 0) {
            uVar3 = cgltf_skip_json(tokens,iVar5 + 1);
            goto LAB_002777bf;
          }
          if (tokens[(long)iVar5 + 1].type != JSMN_OBJECT) {
            return -1;
          }
          iVar2 = tokens[(long)iVar5 + 1].size;
          uVar8 = (ulong)(iVar5 + 2);
          out_extras = (cgltf_texture_view *)0x0;
          local_64 = 0;
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          while (local_64 != iVar2) {
            iVar5 = (int)uVar8;
            if (tokens[uVar8].type != JSMN_STRING) {
              return -1;
            }
            if (tokens[uVar8].size == 0) {
              return -1;
            }
            iVar4 = cgltf_json_strcmp(tokens + uVar8,json_chunk,"KHR_texture_transform");
            if (iVar4 == 0) {
              out_texture_view->has_transform = 1;
              if (tokens[(long)iVar5 + 1].type != JSMN_OBJECT) {
                return -1;
              }
              iVar4 = tokens[(long)iVar5 + 1].size;
              uVar3 = iVar5 + 2;
              if (iVar4 < 1) {
                iVar4 = 0;
              }
              iVar4 = iVar4 + 1;
              while( true ) {
                uVar8 = (ulong)uVar3;
                iVar4 = iVar4 + -1;
                if (iVar4 == 0) break;
                if (tokens[uVar8].type != JSMN_STRING) {
                  return -1;
                }
                pjVar10 = tokens + uVar8;
                if (pjVar10->size == 0) {
                  return -1;
                }
                iVar5 = cgltf_json_strcmp(pjVar10,json_chunk,"offset");
                out_extras = (cgltf_texture_view *)&out_texture_view->transform;
                if (iVar5 == 0) {
LAB_0027794d:
                  uVar3 = cgltf_parse_json_float_array
                                    (tokens,uVar3 + 1,json_chunk,(float *)out_extras,2);
                }
                else {
                  iVar5 = cgltf_json_strcmp(pjVar10,json_chunk,"rotation");
                  pcVar6 = (cgltf_texture_view *)(long)(int)uVar3;
                  if (iVar5 == 0) {
                    cVar11 = cgltf_json_to_float(tokens + (long)((long)&pcVar6->texture + 1),
                                                 json_chunk);
                    (out_texture_view->transform).rotation = cVar11;
LAB_00277975:
                    uVar3 = uVar3 + 2;
                    out_extras = pcVar6;
                  }
                  else {
                    pcVar7 = pcVar6;
                    iVar5 = cgltf_json_strcmp(pjVar10,json_chunk,"scale");
                    out_extras = (cgltf_texture_view *)(out_texture_view->transform).scale;
                    if (iVar5 == 0) goto LAB_0027794d;
                    iVar5 = cgltf_json_strcmp(pjVar10,json_chunk,"texCoord");
                    if (iVar5 == 0) {
                      iVar5 = cgltf_json_to_int(tokens + (long)((long)&pcVar6->texture + 1),
                                                json_chunk);
                      (out_texture_view->transform).texcoord = iVar5;
                      pcVar6 = out_texture_view;
                      goto LAB_00277975;
                    }
                    uVar3 = cgltf_skip_json(tokens,uVar3 + 1);
                    out_extras = pcVar7;
                  }
                }
                if ((int)uVar3 < 0) {
                  return uVar3;
                }
              }
            }
            else {
              uVar3 = cgltf_skip_json(tokens,iVar5 + 1);
              uVar8 = (ulong)uVar3;
            }
            local_64 = local_64 + 1;
            if ((int)uVar8 < 0) {
              return (int)uVar8;
            }
          }
        }
      }
      iVar9 = iVar9 + 1;
      iVar5 = (int)uVar8;
    } while (-1 < iVar5);
  }
  else {
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

static int cgltf_parse_json_texture_view(jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_texture_view* out_texture_view)
{
    CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);

    out_texture_view->scale = 1.0f;
    cgltf_fill_float_array(out_texture_view->transform.scale, 2, 1.0f);

    int size = tokens[i].size;
    ++i;

    for (int j = 0; j < size; ++j)
    {
        CGLTF_CHECK_KEY(tokens[i]);

        if (cgltf_json_strcmp(tokens + i, json_chunk, "index") == 0)
        {
            ++i;
            out_texture_view->texture = CGLTF_PTRINDEX(cgltf_texture, cgltf_json_to_int(tokens + i, json_chunk));
            ++i;
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "texCoord") == 0)
        {
            ++i;
            out_texture_view->texcoord = cgltf_json_to_int(tokens + i, json_chunk);
            ++i;
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "scale") == 0)
        {
            ++i;
            out_texture_view->scale = cgltf_json_to_float(tokens + i, json_chunk);
            ++i;
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "strength") == 0)
        {
            ++i;
            out_texture_view->scale = cgltf_json_to_float(tokens + i, json_chunk);
            ++i;
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "extras") == 0)
        {
            i = cgltf_parse_json_extras(tokens, i + 1, json_chunk, &out_texture_view->extras);
        }
        else if (cgltf_json_strcmp(tokens + i, json_chunk, "extensions") == 0)
        {
            ++i;

            CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);

            int extensions_size = tokens[i].size;
            ++i;

            for (int k = 0; k < extensions_size; ++k)
            {
                CGLTF_CHECK_KEY(tokens[i]);

                if (cgltf_json_strcmp(tokens+i, json_chunk, "KHR_texture_transform") == 0)
                {
                    out_texture_view->has_transform = 1;
                    i = cgltf_parse_json_texture_transform(tokens, i + 1, json_chunk, &out_texture_view->transform);
                }
                else
                {
                    i = cgltf_skip_json(tokens, i+1);
                }

                if (i < 0)
                {
                    return i;
                }
            }
        }
        else
        {
            i = cgltf_skip_json(tokens, i + 1);
        }

        if (i < 0)
        {
            return i;
        }
    }

    return i;
}